

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

bool __thiscall
icu_63::RBBITableBuilder::findDuplicateSafeState(RBBITableBuilder *this,IntPair *states)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ushort uVar14;
  uint uVar9;
  
  iVar3 = this->fSafeTable->count;
  iVar8 = states->first;
  while( true ) {
    if (iVar3 + -1 <= iVar8) {
      return false;
    }
    pvVar5 = UVector::elementAt(this->fSafeTable,iVar8);
    uVar12 = states->first;
    iVar8 = uVar12 + 1;
    states->second = iVar8;
    if (iVar8 < iVar3) break;
LAB_002a1bb9:
    iVar8 = uVar12 + 1;
    states->first = iVar8;
  }
LAB_002a1af1:
  pvVar6 = UVector::elementAt(this->fSafeTable,iVar8);
  sVar1 = *(short *)((long)pvVar5 + 8);
  if (sVar1 < 0) {
    uVar7 = *(uint *)((long)pvVar5 + 0xc);
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if ((int)uVar7 < 1) {
    return true;
  }
  lVar13 = (long)pvVar5 + 10;
  if (((int)sVar1 & 2U) == 0) {
    lVar13 = *(long *)((long)pvVar5 + 0x18);
  }
  sVar1 = *(short *)((long)pvVar6 + 8);
  uVar4 = (int)sVar1 >> 5;
  if (sVar1 < 0) {
    uVar4 = *(uint *)((long)pvVar6 + 0xc);
  }
  uVar11 = 0;
  do {
    uVar14 = 0xffff;
    if (uVar11 < uVar4) {
      lVar10 = (long)pvVar6 + 10;
      if (((int)sVar1 & 2U) == 0) {
        lVar10 = *(long *)((long)pvVar6 + 0x18);
      }
      uVar14 = *(ushort *)(lVar10 + uVar11 * 2);
    }
    uVar2 = *(ushort *)(lVar13 + uVar11 * 2);
    if (uVar2 != uVar14) {
      uVar12 = states->first;
      if (((uVar12 != uVar2) && (uVar9 = states->second, uVar9 != uVar2)) ||
         ((uVar12 != uVar14 && (uVar9 = states->second, uVar9 != uVar14)))) break;
    }
    uVar11 = uVar11 + 1;
    if (uVar7 == uVar11) {
      return true;
    }
  } while( true );
  iVar8 = uVar9 + 1;
  states->second = iVar8;
  if (iVar3 <= iVar8) goto LAB_002a1bb9;
  goto LAB_002a1af1;
}

Assistant:

bool RBBITableBuilder::findDuplicateSafeState(IntPair *states) {
    int32_t numStates = fSafeTable->size();

    for (; states->first<numStates-1; states->first++) {
        UnicodeString *firstRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->first));
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            UnicodeString *duplRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->second));
            bool rowsMatch = true;
            int32_t numCols = firstRow->length();
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstRow->charAt(col);
                int32_t duplVal = duplRow->charAt(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}